

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraphReadJSON.cxx
# Opt level: O0

ReadFileResult
anon_unknown.dwarf_40300e::ConditionHelper
          (unique_ptr<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>
           *out,Value *value)

{
  bool bVar1;
  pointer pCVar2;
  Value *pVVar3;
  type out_00;
  type out_01;
  type out_02;
  type out_03;
  pointer pAVar4;
  type out_04;
  type out_05;
  ReadFileResult _result_5;
  __single_object c_6;
  ReadFileResult _result_4;
  __single_object c_5;
  unique_ptr<cmCMakePresetsGraphInternal::NotCondition,_std::default_delete<cmCMakePresetsGraphInternal::NotCondition>_>
  local_c8;
  ReadFileResult local_bc;
  ReadFileResult _result_3;
  __single_object c_4;
  unique_ptr<cmCMakePresetsGraphInternal::NotCondition,_std::default_delete<cmCMakePresetsGraphInternal::NotCondition>_>
  local_a8;
  ReadFileResult local_9c;
  ReadFileResult _result_2;
  __single_object c_3;
  unique_ptr<cmCMakePresetsGraphInternal::NotCondition,_std::default_delete<cmCMakePresetsGraphInternal::NotCondition>_>
  local_88;
  ReadFileResult local_7c;
  ReadFileResult _result_1;
  __single_object c_2;
  ReadFileResult _result;
  __single_object c_1;
  String type;
  unique_ptr<cmCMakePresetsGraphInternal::ConstCondition,_std::default_delete<cmCMakePresetsGraphInternal::ConstCondition>_>
  local_28;
  __single_object c;
  Value *value_local;
  unique_ptr<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>
  *out_local;
  
  c._M_t.
  super___uniq_ptr_impl<cmCMakePresetsGraphInternal::ConstCondition,_std::default_delete<cmCMakePresetsGraphInternal::ConstCondition>_>
  ._M_t.
  super__Tuple_impl<0UL,_cmCMakePresetsGraphInternal::ConstCondition_*,_std::default_delete<cmCMakePresetsGraphInternal::ConstCondition>_>
  .super__Head_base<0UL,_cmCMakePresetsGraphInternal::ConstCondition_*,_false>._M_head_impl =
       (__uniq_ptr_data<cmCMakePresetsGraphInternal::ConstCondition,_std::default_delete<cmCMakePresetsGraphInternal::ConstCondition>,_true,_true>
        )(__uniq_ptr_data<cmCMakePresetsGraphInternal::ConstCondition,_std::default_delete<cmCMakePresetsGraphInternal::ConstCondition>,_true,_true>
          )value;
  if (value == (Value *)0x0) {
    std::
    unique_ptr<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>
    ::reset(out,(pointer)0x0);
    out_local._4_4_ = READ_OK;
  }
  else {
    bVar1 = Json::Value::isBool(value);
    if (bVar1) {
      std::make_unique<cmCMakePresetsGraphInternal::ConstCondition>();
      bVar1 = Json::Value::asBool((Value *)c._M_t.
                                           super___uniq_ptr_impl<cmCMakePresetsGraphInternal::ConstCondition,_std::default_delete<cmCMakePresetsGraphInternal::ConstCondition>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_cmCMakePresetsGraphInternal::ConstCondition_*,_std::default_delete<cmCMakePresetsGraphInternal::ConstCondition>_>
                                           .
                                           super__Head_base<0UL,_cmCMakePresetsGraphInternal::ConstCondition_*,_false>
                                           ._M_head_impl);
      pCVar2 = std::
               unique_ptr<cmCMakePresetsGraphInternal::ConstCondition,_std::default_delete<cmCMakePresetsGraphInternal::ConstCondition>_>
               ::operator->(&local_28);
      pCVar2->Value = bVar1;
      std::
      unique_ptr<cmCMakePresetsGraph::Condition,std::default_delete<cmCMakePresetsGraph::Condition>>
      ::operator=((unique_ptr<cmCMakePresetsGraph::Condition,std::default_delete<cmCMakePresetsGraph::Condition>>
                   *)out,&local_28);
      out_local._4_4_ = READ_OK;
      std::
      unique_ptr<cmCMakePresetsGraphInternal::ConstCondition,_std::default_delete<cmCMakePresetsGraphInternal::ConstCondition>_>
      ::~unique_ptr(&local_28);
    }
    else {
      bVar1 = Json::Value::isNull((Value *)c._M_t.
                                           super___uniq_ptr_impl<cmCMakePresetsGraphInternal::ConstCondition,_std::default_delete<cmCMakePresetsGraphInternal::ConstCondition>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_cmCMakePresetsGraphInternal::ConstCondition_*,_std::default_delete<cmCMakePresetsGraphInternal::ConstCondition>_>
                                           .
                                           super__Head_base<0UL,_cmCMakePresetsGraphInternal::ConstCondition_*,_false>
                                           ._M_head_impl);
      if (bVar1) {
        std::make_unique<cmCMakePresetsGraphInternal::NullCondition>();
        std::
        unique_ptr<cmCMakePresetsGraph::Condition,std::default_delete<cmCMakePresetsGraph::Condition>>
        ::operator=((unique_ptr<cmCMakePresetsGraph::Condition,std::default_delete<cmCMakePresetsGraph::Condition>>
                     *)out,(unique_ptr<cmCMakePresetsGraphInternal::NullCondition,_std::default_delete<cmCMakePresetsGraphInternal::NullCondition>_>
                            *)((long)&type.field_2 + 8));
        std::
        unique_ptr<cmCMakePresetsGraphInternal::NullCondition,_std::default_delete<cmCMakePresetsGraphInternal::NullCondition>_>
        ::~unique_ptr((unique_ptr<cmCMakePresetsGraphInternal::NullCondition,_std::default_delete<cmCMakePresetsGraphInternal::NullCondition>_>
                       *)((long)&type.field_2 + 8));
        out_local._4_4_ = READ_OK;
      }
      else {
        bVar1 = Json::Value::isObject
                          ((Value *)c._M_t.
                                    super___uniq_ptr_impl<cmCMakePresetsGraphInternal::ConstCondition,_std::default_delete<cmCMakePresetsGraphInternal::ConstCondition>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_cmCMakePresetsGraphInternal::ConstCondition_*,_std::default_delete<cmCMakePresetsGraphInternal::ConstCondition>_>
                                    .
                                    super__Head_base<0UL,_cmCMakePresetsGraphInternal::ConstCondition_*,_false>
                                    ._M_head_impl);
        if (bVar1) {
          bVar1 = Json::Value::isMember
                            ((Value *)c._M_t.
                                      super___uniq_ptr_impl<cmCMakePresetsGraphInternal::ConstCondition,_std::default_delete<cmCMakePresetsGraphInternal::ConstCondition>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_cmCMakePresetsGraphInternal::ConstCondition_*,_std::default_delete<cmCMakePresetsGraphInternal::ConstCondition>_>
                                      .
                                      super__Head_base<0UL,_cmCMakePresetsGraphInternal::ConstCondition_*,_false>
                                      ._M_head_impl,"type");
          if (!bVar1) {
            return INVALID_CONDITION;
          }
          pVVar3 = Json::Value::operator[]
                             ((Value *)c._M_t.
                                       super___uniq_ptr_impl<cmCMakePresetsGraphInternal::ConstCondition,_std::default_delete<cmCMakePresetsGraphInternal::ConstCondition>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_cmCMakePresetsGraphInternal::ConstCondition_*,_std::default_delete<cmCMakePresetsGraphInternal::ConstCondition>_>
                                       .
                                       super__Head_base<0UL,_cmCMakePresetsGraphInternal::ConstCondition_*,_false>
                                       ._M_head_impl,"type");
          bVar1 = Json::Value::isString(pVVar3);
          if (!bVar1) {
            return INVALID_CONDITION;
          }
          pVVar3 = Json::Value::operator[]
                             ((Value *)c._M_t.
                                       super___uniq_ptr_impl<cmCMakePresetsGraphInternal::ConstCondition,_std::default_delete<cmCMakePresetsGraphInternal::ConstCondition>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_cmCMakePresetsGraphInternal::ConstCondition_*,_std::default_delete<cmCMakePresetsGraphInternal::ConstCondition>_>
                                       .
                                       super__Head_base<0UL,_cmCMakePresetsGraphInternal::ConstCondition_*,_false>
                                       ._M_head_impl,"type");
          Json::Value::asString_abi_cxx11_((String *)&c_1,pVVar3);
          bVar1 = std::operator==((String *)&c_1,"const");
          if (bVar1) {
            std::make_unique<cmCMakePresetsGraphInternal::ConstCondition>();
            out_00 = std::
                     unique_ptr<cmCMakePresetsGraphInternal::ConstCondition,_std::default_delete<cmCMakePresetsGraphInternal::ConstCondition>_>
                     ::operator*((unique_ptr<cmCMakePresetsGraphInternal::ConstCondition,_std::default_delete<cmCMakePresetsGraphInternal::ConstCondition>_>
                                  *)&stack0xffffffffffffff98);
            c_2._M_t.
            super___uniq_ptr_impl<cmCMakePresetsGraphInternal::EqualsCondition,_std::default_delete<cmCMakePresetsGraphInternal::EqualsCondition>_>
            ._M_t.
            super__Tuple_impl<0UL,_cmCMakePresetsGraphInternal::EqualsCondition_*,_std::default_delete<cmCMakePresetsGraphInternal::EqualsCondition>_>
            .super__Head_base<0UL,_cmCMakePresetsGraphInternal::EqualsCondition_*,_false>.
            _M_head_impl._4_4_ =
                 cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::
                 Object<cmCMakePresetsGraphInternal::ConstCondition>::operator()
                           ((Object<cmCMakePresetsGraphInternal::ConstCondition> *)
                            (anonymous_namespace)::ConstConditionHelper,out_00,
                            (Value *)c._M_t.
                                     super___uniq_ptr_impl<cmCMakePresetsGraphInternal::ConstCondition,_std::default_delete<cmCMakePresetsGraphInternal::ConstCondition>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_cmCMakePresetsGraphInternal::ConstCondition_*,_std::default_delete<cmCMakePresetsGraphInternal::ConstCondition>_>
                                     .
                                     super__Head_base<0UL,_cmCMakePresetsGraphInternal::ConstCondition_*,_false>
                                     ._M_head_impl);
            out_local._4_4_ =
                 c_2._M_t.
                 super___uniq_ptr_impl<cmCMakePresetsGraphInternal::EqualsCondition,_std::default_delete<cmCMakePresetsGraphInternal::EqualsCondition>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_cmCMakePresetsGraphInternal::EqualsCondition_*,_std::default_delete<cmCMakePresetsGraphInternal::EqualsCondition>_>
                 .super__Head_base<0UL,_cmCMakePresetsGraphInternal::EqualsCondition_*,_false>.
                 _M_head_impl._4_4_;
            if (c_2._M_t.
                super___uniq_ptr_impl<cmCMakePresetsGraphInternal::EqualsCondition,_std::default_delete<cmCMakePresetsGraphInternal::EqualsCondition>_>
                ._M_t.
                super__Tuple_impl<0UL,_cmCMakePresetsGraphInternal::EqualsCondition_*,_std::default_delete<cmCMakePresetsGraphInternal::EqualsCondition>_>
                .super__Head_base<0UL,_cmCMakePresetsGraphInternal::EqualsCondition_*,_false>.
                _M_head_impl._4_4_ == READ_OK) {
              std::
              unique_ptr<cmCMakePresetsGraph::Condition,std::default_delete<cmCMakePresetsGraph::Condition>>
              ::operator=((unique_ptr<cmCMakePresetsGraph::Condition,std::default_delete<cmCMakePresetsGraph::Condition>>
                           *)out,(unique_ptr<cmCMakePresetsGraphInternal::ConstCondition,_std::default_delete<cmCMakePresetsGraphInternal::ConstCondition>_>
                                  *)&stack0xffffffffffffff98);
              out_local._4_4_ = READ_OK;
            }
            c_2._M_t.
            super___uniq_ptr_impl<cmCMakePresetsGraphInternal::EqualsCondition,_std::default_delete<cmCMakePresetsGraphInternal::EqualsCondition>_>
            ._M_t.
            super__Tuple_impl<0UL,_cmCMakePresetsGraphInternal::EqualsCondition_*,_std::default_delete<cmCMakePresetsGraphInternal::EqualsCondition>_>
            .super__Head_base<0UL,_cmCMakePresetsGraphInternal::EqualsCondition_*,_false>.
            _M_head_impl._0_4_ = 1;
            std::
            unique_ptr<cmCMakePresetsGraphInternal::ConstCondition,_std::default_delete<cmCMakePresetsGraphInternal::ConstCondition>_>
            ::~unique_ptr((unique_ptr<cmCMakePresetsGraphInternal::ConstCondition,_std::default_delete<cmCMakePresetsGraphInternal::ConstCondition>_>
                           *)&stack0xffffffffffffff98);
          }
          else {
            bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&c_1,"equals");
            if ((bVar1) ||
               (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)&c_1,"notEquals"), bVar1)) {
              std::make_unique<cmCMakePresetsGraphInternal::EqualsCondition>();
              out_01 = std::
                       unique_ptr<cmCMakePresetsGraphInternal::EqualsCondition,_std::default_delete<cmCMakePresetsGraphInternal::EqualsCondition>_>
                       ::operator*((unique_ptr<cmCMakePresetsGraphInternal::EqualsCondition,_std::default_delete<cmCMakePresetsGraphInternal::EqualsCondition>_>
                                    *)&stack0xffffffffffffff88);
              local_7c = cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::
                         Object<cmCMakePresetsGraphInternal::EqualsCondition>::operator()
                                   ((Object<cmCMakePresetsGraphInternal::EqualsCondition> *)
                                    (anonymous_namespace)::EqualsConditionHelper,out_01,
                                    (Value *)c._M_t.
                                             super___uniq_ptr_impl<cmCMakePresetsGraphInternal::ConstCondition,_std::default_delete<cmCMakePresetsGraphInternal::ConstCondition>_>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_cmCMakePresetsGraphInternal::ConstCondition_*,_std::default_delete<cmCMakePresetsGraphInternal::ConstCondition>_>
                                             .
                                             super__Head_base<0UL,_cmCMakePresetsGraphInternal::ConstCondition_*,_false>
                                             ._M_head_impl);
              out_local._4_4_ = local_7c;
              if (local_7c == READ_OK) {
                std::
                unique_ptr<cmCMakePresetsGraph::Condition,std::default_delete<cmCMakePresetsGraph::Condition>>
                ::operator=((unique_ptr<cmCMakePresetsGraph::Condition,std::default_delete<cmCMakePresetsGraph::Condition>>
                             *)out,(unique_ptr<cmCMakePresetsGraphInternal::EqualsCondition,_std::default_delete<cmCMakePresetsGraphInternal::EqualsCondition>_>
                                    *)&stack0xffffffffffffff88);
                bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)&c_1,"notEquals");
                if (bVar1) {
                  std::
                  unique_ptr<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>
                  ::unique_ptr((unique_ptr<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>
                                *)&c_3,out);
                  InvertCondition((anon_unknown_dwarf_40300e *)&local_88,
                                  (unique_ptr<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>
                                   *)&c_3);
                  std::
                  unique_ptr<cmCMakePresetsGraph::Condition,std::default_delete<cmCMakePresetsGraph::Condition>>
                  ::operator=((unique_ptr<cmCMakePresetsGraph::Condition,std::default_delete<cmCMakePresetsGraph::Condition>>
                               *)out,&local_88);
                  std::
                  unique_ptr<cmCMakePresetsGraphInternal::NotCondition,_std::default_delete<cmCMakePresetsGraphInternal::NotCondition>_>
                  ::~unique_ptr(&local_88);
                  std::
                  unique_ptr<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>
                  ::~unique_ptr((unique_ptr<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>
                                 *)&c_3);
                }
                out_local._4_4_ = READ_OK;
              }
              c_2._M_t.
              super___uniq_ptr_impl<cmCMakePresetsGraphInternal::EqualsCondition,_std::default_delete<cmCMakePresetsGraphInternal::EqualsCondition>_>
              ._M_t.
              super__Tuple_impl<0UL,_cmCMakePresetsGraphInternal::EqualsCondition_*,_std::default_delete<cmCMakePresetsGraphInternal::EqualsCondition>_>
              .super__Head_base<0UL,_cmCMakePresetsGraphInternal::EqualsCondition_*,_false>.
              _M_head_impl._0_4_ = 1;
              std::
              unique_ptr<cmCMakePresetsGraphInternal::EqualsCondition,_std::default_delete<cmCMakePresetsGraphInternal::EqualsCondition>_>
              ::~unique_ptr((unique_ptr<cmCMakePresetsGraphInternal::EqualsCondition,_std::default_delete<cmCMakePresetsGraphInternal::EqualsCondition>_>
                             *)&stack0xffffffffffffff88);
            }
            else {
              bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)&c_1,"inList");
              if ((bVar1) ||
                 (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)&c_1,"notInList"), bVar1)) {
                std::make_unique<cmCMakePresetsGraphInternal::InListCondition>();
                out_02 = std::
                         unique_ptr<cmCMakePresetsGraphInternal::InListCondition,_std::default_delete<cmCMakePresetsGraphInternal::InListCondition>_>
                         ::operator*((unique_ptr<cmCMakePresetsGraphInternal::InListCondition,_std::default_delete<cmCMakePresetsGraphInternal::InListCondition>_>
                                      *)&stack0xffffffffffffff68);
                local_9c = cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::
                           Object<cmCMakePresetsGraphInternal::InListCondition>::operator()
                                     ((Object<cmCMakePresetsGraphInternal::InListCondition> *)
                                      (anonymous_namespace)::InListConditionHelper,out_02,
                                      (Value *)c._M_t.
                                               super___uniq_ptr_impl<cmCMakePresetsGraphInternal::ConstCondition,_std::default_delete<cmCMakePresetsGraphInternal::ConstCondition>_>
                                               ._M_t.
                                               super__Tuple_impl<0UL,_cmCMakePresetsGraphInternal::ConstCondition_*,_std::default_delete<cmCMakePresetsGraphInternal::ConstCondition>_>
                                               .
                                               super__Head_base<0UL,_cmCMakePresetsGraphInternal::ConstCondition_*,_false>
                                               ._M_head_impl);
                out_local._4_4_ = local_9c;
                if (local_9c == READ_OK) {
                  std::
                  unique_ptr<cmCMakePresetsGraph::Condition,std::default_delete<cmCMakePresetsGraph::Condition>>
                  ::operator=((unique_ptr<cmCMakePresetsGraph::Condition,std::default_delete<cmCMakePresetsGraph::Condition>>
                               *)out,(unique_ptr<cmCMakePresetsGraphInternal::InListCondition,_std::default_delete<cmCMakePresetsGraphInternal::InListCondition>_>
                                      *)&stack0xffffffffffffff68);
                  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)&c_1,"notInList");
                  if (bVar1) {
                    std::
                    unique_ptr<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>
                    ::unique_ptr((unique_ptr<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>
                                  *)&c_4,out);
                    InvertCondition((anon_unknown_dwarf_40300e *)&local_a8,
                                    (unique_ptr<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>
                                     *)&c_4);
                    std::
                    unique_ptr<cmCMakePresetsGraph::Condition,std::default_delete<cmCMakePresetsGraph::Condition>>
                    ::operator=((unique_ptr<cmCMakePresetsGraph::Condition,std::default_delete<cmCMakePresetsGraph::Condition>>
                                 *)out,&local_a8);
                    std::
                    unique_ptr<cmCMakePresetsGraphInternal::NotCondition,_std::default_delete<cmCMakePresetsGraphInternal::NotCondition>_>
                    ::~unique_ptr(&local_a8);
                    std::
                    unique_ptr<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>
                    ::~unique_ptr((unique_ptr<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>
                                   *)&c_4);
                  }
                  out_local._4_4_ = READ_OK;
                }
                c_2._M_t.
                super___uniq_ptr_impl<cmCMakePresetsGraphInternal::EqualsCondition,_std::default_delete<cmCMakePresetsGraphInternal::EqualsCondition>_>
                ._M_t.
                super__Tuple_impl<0UL,_cmCMakePresetsGraphInternal::EqualsCondition_*,_std::default_delete<cmCMakePresetsGraphInternal::EqualsCondition>_>
                .super__Head_base<0UL,_cmCMakePresetsGraphInternal::EqualsCondition_*,_false>.
                _M_head_impl._0_4_ = 1;
                std::
                unique_ptr<cmCMakePresetsGraphInternal::InListCondition,_std::default_delete<cmCMakePresetsGraphInternal::InListCondition>_>
                ::~unique_ptr((unique_ptr<cmCMakePresetsGraphInternal::InListCondition,_std::default_delete<cmCMakePresetsGraphInternal::InListCondition>_>
                               *)&stack0xffffffffffffff68);
              }
              else {
                bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)&c_1,"matches");
                if ((bVar1) ||
                   (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)&c_1,"notMatches"), bVar1)) {
                  std::make_unique<cmCMakePresetsGraphInternal::MatchesCondition>();
                  out_03 = std::
                           unique_ptr<cmCMakePresetsGraphInternal::MatchesCondition,_std::default_delete<cmCMakePresetsGraphInternal::MatchesCondition>_>
                           ::operator*((unique_ptr<cmCMakePresetsGraphInternal::MatchesCondition,_std::default_delete<cmCMakePresetsGraphInternal::MatchesCondition>_>
                                        *)&stack0xffffffffffffff48);
                  local_bc = cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::
                             Object<cmCMakePresetsGraphInternal::MatchesCondition>::operator()
                                       ((Object<cmCMakePresetsGraphInternal::MatchesCondition> *)
                                        (anonymous_namespace)::MatchesConditionHelper,out_03,
                                        (Value *)c._M_t.
                                                 super___uniq_ptr_impl<cmCMakePresetsGraphInternal::ConstCondition,_std::default_delete<cmCMakePresetsGraphInternal::ConstCondition>_>
                                                 ._M_t.
                                                 super__Tuple_impl<0UL,_cmCMakePresetsGraphInternal::ConstCondition_*,_std::default_delete<cmCMakePresetsGraphInternal::ConstCondition>_>
                                                 .
                                                 super__Head_base<0UL,_cmCMakePresetsGraphInternal::ConstCondition_*,_false>
                                                 ._M_head_impl);
                  out_local._4_4_ = local_bc;
                  if (local_bc == READ_OK) {
                    std::
                    unique_ptr<cmCMakePresetsGraph::Condition,std::default_delete<cmCMakePresetsGraph::Condition>>
                    ::operator=((unique_ptr<cmCMakePresetsGraph::Condition,std::default_delete<cmCMakePresetsGraph::Condition>>
                                 *)out,(unique_ptr<cmCMakePresetsGraphInternal::MatchesCondition,_std::default_delete<cmCMakePresetsGraphInternal::MatchesCondition>_>
                                        *)&stack0xffffffffffffff48);
                    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)&c_1,"notMatches");
                    if (bVar1) {
                      std::
                      unique_ptr<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>
                      ::unique_ptr((unique_ptr<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>
                                    *)&c_5,out);
                      InvertCondition((anon_unknown_dwarf_40300e *)&local_c8,
                                      (unique_ptr<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>
                                       *)&c_5);
                      std::
                      unique_ptr<cmCMakePresetsGraph::Condition,std::default_delete<cmCMakePresetsGraph::Condition>>
                      ::operator=((unique_ptr<cmCMakePresetsGraph::Condition,std::default_delete<cmCMakePresetsGraph::Condition>>
                                   *)out,&local_c8);
                      std::
                      unique_ptr<cmCMakePresetsGraphInternal::NotCondition,_std::default_delete<cmCMakePresetsGraphInternal::NotCondition>_>
                      ::~unique_ptr(&local_c8);
                      std::
                      unique_ptr<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>
                      ::~unique_ptr((unique_ptr<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>
                                     *)&c_5);
                    }
                    out_local._4_4_ = READ_OK;
                  }
                  c_2._M_t.
                  super___uniq_ptr_impl<cmCMakePresetsGraphInternal::EqualsCondition,_std::default_delete<cmCMakePresetsGraphInternal::EqualsCondition>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_cmCMakePresetsGraphInternal::EqualsCondition_*,_std::default_delete<cmCMakePresetsGraphInternal::EqualsCondition>_>
                  .super__Head_base<0UL,_cmCMakePresetsGraphInternal::EqualsCondition_*,_false>.
                  _M_head_impl._0_4_ = 1;
                  std::
                  unique_ptr<cmCMakePresetsGraphInternal::MatchesCondition,_std::default_delete<cmCMakePresetsGraphInternal::MatchesCondition>_>
                  ::~unique_ptr((unique_ptr<cmCMakePresetsGraphInternal::MatchesCondition,_std::default_delete<cmCMakePresetsGraphInternal::MatchesCondition>_>
                                 *)&stack0xffffffffffffff48);
                }
                else {
                  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)&c_1,"anyOf");
                  if ((bVar1) ||
                     (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)&c_1,"allOf"), bVar1)) {
                    std::make_unique<cmCMakePresetsGraphInternal::AnyAllOfCondition>();
                    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)&c_1,"anyOf");
                    pAVar4 = std::
                             unique_ptr<cmCMakePresetsGraphInternal::AnyAllOfCondition,_std::default_delete<cmCMakePresetsGraphInternal::AnyAllOfCondition>_>
                             ::operator->((unique_ptr<cmCMakePresetsGraphInternal::AnyAllOfCondition,_std::default_delete<cmCMakePresetsGraphInternal::AnyAllOfCondition>_>
                                           *)&stack0xffffffffffffff28);
                    pAVar4->StopValue = bVar1;
                    out_04 = std::
                             unique_ptr<cmCMakePresetsGraphInternal::AnyAllOfCondition,_std::default_delete<cmCMakePresetsGraphInternal::AnyAllOfCondition>_>
                             ::operator*((unique_ptr<cmCMakePresetsGraphInternal::AnyAllOfCondition,_std::default_delete<cmCMakePresetsGraphInternal::AnyAllOfCondition>_>
                                          *)&stack0xffffffffffffff28);
                    c_6._M_t.
                    super___uniq_ptr_impl<cmCMakePresetsGraphInternal::NotCondition,_std::default_delete<cmCMakePresetsGraphInternal::NotCondition>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_cmCMakePresetsGraphInternal::NotCondition_*,_std::default_delete<cmCMakePresetsGraphInternal::NotCondition>_>
                    .super__Head_base<0UL,_cmCMakePresetsGraphInternal::NotCondition_*,_false>.
                    _M_head_impl._4_4_ =
                         cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::
                         Object<cmCMakePresetsGraphInternal::AnyAllOfCondition>::operator()
                                   ((Object<cmCMakePresetsGraphInternal::AnyAllOfCondition> *)
                                    (anonymous_namespace)::AnyAllOfConditionHelper,out_04,
                                    (Value *)c._M_t.
                                             super___uniq_ptr_impl<cmCMakePresetsGraphInternal::ConstCondition,_std::default_delete<cmCMakePresetsGraphInternal::ConstCondition>_>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_cmCMakePresetsGraphInternal::ConstCondition_*,_std::default_delete<cmCMakePresetsGraphInternal::ConstCondition>_>
                                             .
                                             super__Head_base<0UL,_cmCMakePresetsGraphInternal::ConstCondition_*,_false>
                                             ._M_head_impl);
                    out_local._4_4_ =
                         c_6._M_t.
                         super___uniq_ptr_impl<cmCMakePresetsGraphInternal::NotCondition,_std::default_delete<cmCMakePresetsGraphInternal::NotCondition>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_cmCMakePresetsGraphInternal::NotCondition_*,_std::default_delete<cmCMakePresetsGraphInternal::NotCondition>_>
                         .super__Head_base<0UL,_cmCMakePresetsGraphInternal::NotCondition_*,_false>.
                         _M_head_impl._4_4_;
                    if (c_6._M_t.
                        super___uniq_ptr_impl<cmCMakePresetsGraphInternal::NotCondition,_std::default_delete<cmCMakePresetsGraphInternal::NotCondition>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_cmCMakePresetsGraphInternal::NotCondition_*,_std::default_delete<cmCMakePresetsGraphInternal::NotCondition>_>
                        .super__Head_base<0UL,_cmCMakePresetsGraphInternal::NotCondition_*,_false>.
                        _M_head_impl._4_4_ == READ_OK) {
                      std::
                      unique_ptr<cmCMakePresetsGraph::Condition,std::default_delete<cmCMakePresetsGraph::Condition>>
                      ::operator=((unique_ptr<cmCMakePresetsGraph::Condition,std::default_delete<cmCMakePresetsGraph::Condition>>
                                   *)out,(unique_ptr<cmCMakePresetsGraphInternal::AnyAllOfCondition,_std::default_delete<cmCMakePresetsGraphInternal::AnyAllOfCondition>_>
                                          *)&stack0xffffffffffffff28);
                      out_local._4_4_ = READ_OK;
                    }
                    c_2._M_t.
                    super___uniq_ptr_impl<cmCMakePresetsGraphInternal::EqualsCondition,_std::default_delete<cmCMakePresetsGraphInternal::EqualsCondition>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_cmCMakePresetsGraphInternal::EqualsCondition_*,_std::default_delete<cmCMakePresetsGraphInternal::EqualsCondition>_>
                    .super__Head_base<0UL,_cmCMakePresetsGraphInternal::EqualsCondition_*,_false>.
                    _M_head_impl._0_4_ = 1;
                    std::
                    unique_ptr<cmCMakePresetsGraphInternal::AnyAllOfCondition,_std::default_delete<cmCMakePresetsGraphInternal::AnyAllOfCondition>_>
                    ::~unique_ptr((unique_ptr<cmCMakePresetsGraphInternal::AnyAllOfCondition,_std::default_delete<cmCMakePresetsGraphInternal::AnyAllOfCondition>_>
                                   *)&stack0xffffffffffffff28);
                  }
                  else {
                    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)&c_1,"not");
                    if (bVar1) {
                      std::make_unique<cmCMakePresetsGraphInternal::NotCondition>();
                      out_05 = std::
                               unique_ptr<cmCMakePresetsGraphInternal::NotCondition,_std::default_delete<cmCMakePresetsGraphInternal::NotCondition>_>
                               ::operator*((unique_ptr<cmCMakePresetsGraphInternal::NotCondition,_std::default_delete<cmCMakePresetsGraphInternal::NotCondition>_>
                                            *)&stack0xffffffffffffff18);
                      out_local._4_4_ =
                           cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::
                           Object<cmCMakePresetsGraphInternal::NotCondition>::operator()
                                     ((Object<cmCMakePresetsGraphInternal::NotCondition> *)
                                      (anonymous_namespace)::NotConditionHelper,out_05,
                                      (Value *)c._M_t.
                                               super___uniq_ptr_impl<cmCMakePresetsGraphInternal::ConstCondition,_std::default_delete<cmCMakePresetsGraphInternal::ConstCondition>_>
                                               ._M_t.
                                               super__Tuple_impl<0UL,_cmCMakePresetsGraphInternal::ConstCondition_*,_std::default_delete<cmCMakePresetsGraphInternal::ConstCondition>_>
                                               .
                                               super__Head_base<0UL,_cmCMakePresetsGraphInternal::ConstCondition_*,_false>
                                               ._M_head_impl);
                      if (out_local._4_4_ == READ_OK) {
                        std::
                        unique_ptr<cmCMakePresetsGraph::Condition,std::default_delete<cmCMakePresetsGraph::Condition>>
                        ::operator=((unique_ptr<cmCMakePresetsGraph::Condition,std::default_delete<cmCMakePresetsGraph::Condition>>
                                     *)out,(unique_ptr<cmCMakePresetsGraphInternal::NotCondition,_std::default_delete<cmCMakePresetsGraphInternal::NotCondition>_>
                                            *)&stack0xffffffffffffff18);
                        out_local._4_4_ = READ_OK;
                      }
                      c_2._M_t.
                      super___uniq_ptr_impl<cmCMakePresetsGraphInternal::EqualsCondition,_std::default_delete<cmCMakePresetsGraphInternal::EqualsCondition>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_cmCMakePresetsGraphInternal::EqualsCondition_*,_std::default_delete<cmCMakePresetsGraphInternal::EqualsCondition>_>
                      .super__Head_base<0UL,_cmCMakePresetsGraphInternal::EqualsCondition_*,_false>.
                      _M_head_impl._0_4_ = 1;
                      std::
                      unique_ptr<cmCMakePresetsGraphInternal::NotCondition,_std::default_delete<cmCMakePresetsGraphInternal::NotCondition>_>
                      ::~unique_ptr((unique_ptr<cmCMakePresetsGraphInternal::NotCondition,_std::default_delete<cmCMakePresetsGraphInternal::NotCondition>_>
                                     *)&stack0xffffffffffffff18);
                    }
                    else {
                      c_2._M_t.
                      super___uniq_ptr_impl<cmCMakePresetsGraphInternal::EqualsCondition,_std::default_delete<cmCMakePresetsGraphInternal::EqualsCondition>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_cmCMakePresetsGraphInternal::EqualsCondition_*,_std::default_delete<cmCMakePresetsGraphInternal::EqualsCondition>_>
                      .super__Head_base<0UL,_cmCMakePresetsGraphInternal::EqualsCondition_*,_false>.
                      _M_head_impl._0_4_ = 0;
                    }
                  }
                }
              }
            }
          }
          std::__cxx11::string::~string((string *)&c_1);
          if ((int)c_2._M_t.
                   super___uniq_ptr_impl<cmCMakePresetsGraphInternal::EqualsCondition,_std::default_delete<cmCMakePresetsGraphInternal::EqualsCondition>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_cmCMakePresetsGraphInternal::EqualsCondition_*,_std::default_delete<cmCMakePresetsGraphInternal::EqualsCondition>_>
                   .super__Head_base<0UL,_cmCMakePresetsGraphInternal::EqualsCondition_*,_false>.
                   _M_head_impl != 0) {
            return out_local._4_4_;
          }
        }
        out_local._4_4_ = INVALID_CONDITION;
      }
    }
  }
  return out_local._4_4_;
}

Assistant:

ReadFileResult ConditionHelper(
  std::unique_ptr<cmCMakePresetsGraph::Condition>& out,
  const Json::Value* value)
{
  if (!value) {
    out.reset();
    return ReadFileResult::READ_OK;
  }

  if (value->isBool()) {
    auto c = cm::make_unique<cmCMakePresetsGraphInternal::ConstCondition>();
    c->Value = value->asBool();
    out = std::move(c);
    return ReadFileResult::READ_OK;
  }

  if (value->isNull()) {
    out = cm::make_unique<cmCMakePresetsGraphInternal::NullCondition>();
    return ReadFileResult::READ_OK;
  }

  if (value->isObject()) {
    if (!value->isMember("type")) {
      return ReadFileResult::INVALID_CONDITION;
    }

    if (!(*value)["type"].isString()) {
      return ReadFileResult::INVALID_CONDITION;
    }
    auto type = (*value)["type"].asString();

    if (type == "const") {
      auto c = cm::make_unique<cmCMakePresetsGraphInternal::ConstCondition>();
      CHECK_OK(ConstConditionHelper(*c, value));
      out = std::move(c);
      return ReadFileResult::READ_OK;
    }

    if (type == "equals" || type == "notEquals") {
      auto c = cm::make_unique<cmCMakePresetsGraphInternal::EqualsCondition>();
      CHECK_OK(EqualsConditionHelper(*c, value));
      out = std::move(c);
      if (type == "notEquals") {
        out = InvertCondition(std::move(out));
      }
      return ReadFileResult::READ_OK;
    }

    if (type == "inList" || type == "notInList") {
      auto c = cm::make_unique<cmCMakePresetsGraphInternal::InListCondition>();
      CHECK_OK(InListConditionHelper(*c, value));
      out = std::move(c);
      if (type == "notInList") {
        out = InvertCondition(std::move(out));
      }
      return ReadFileResult::READ_OK;
    }

    if (type == "matches" || type == "notMatches") {
      auto c =
        cm::make_unique<cmCMakePresetsGraphInternal::MatchesCondition>();
      CHECK_OK(MatchesConditionHelper(*c, value));
      out = std::move(c);
      if (type == "notMatches") {
        out = InvertCondition(std::move(out));
      }
      return ReadFileResult::READ_OK;
    }

    if (type == "anyOf" || type == "allOf") {
      auto c =
        cm::make_unique<cmCMakePresetsGraphInternal::AnyAllOfCondition>();
      c->StopValue = (type == "anyOf");
      CHECK_OK(AnyAllOfConditionHelper(*c, value));
      out = std::move(c);
      return ReadFileResult::READ_OK;
    }

    if (type == "not") {
      auto c = cm::make_unique<cmCMakePresetsGraphInternal::NotCondition>();
      CHECK_OK(NotConditionHelper(*c, value));
      out = std::move(c);
      return ReadFileResult::READ_OK;
    }
  }

  return ReadFileResult::INVALID_CONDITION;
}